

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Type_create_struct
              (int count,int *array_of_blocklengths,MPIABI_Aint *array_of_displacements,
              MPIABI_Datatype *array_of_datatypes,MPIABI_Datatype *newtype)

{
  int iVar1;
  MPIABI_Datatype *newtype_local;
  MPIABI_Datatype *array_of_datatypes_local;
  MPIABI_Aint *array_of_displacements_local;
  int *array_of_blocklengths_local;
  int count_local;
  
  iVar1 = MPI_Type_create_struct
                    (count,array_of_blocklengths,array_of_displacements,array_of_datatypes,newtype);
  return iVar1;
}

Assistant:

int
MPIABI_Type_create_struct(int count, const int array_of_blocklengths[],
                          const MPIABI_Aint array_of_displacements[],
                          const MPIABI_Datatype array_of_datatypes[],
                          MPIABI_Datatype *newtype) {
  if (sizeof(MPI_Datatype) == sizeof(MPIABI_Datatype))
    return MPI_Type_create_struct(
        count, array_of_blocklengths, (const MPI_Aint *)array_of_displacements,
        (const MPI_Datatype *)array_of_datatypes, (MPI_Datatype *)newtype);
  std::vector<MPI_Datatype> datatypes(count);
  for (int i = 0; i < count; ++i)
    datatypes[i] = (WPI_Datatype)array_of_datatypes[i];
  const int ierr = MPI_Type_create_struct(
      count, array_of_blocklengths, (const MPI_Aint *)array_of_displacements,
      datatypes.data(), (WPI_DatatypePtr)newtype);
  return ierr;
}